

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

DdNode * CreateTheCodes_rec(DdManager *dd,DdNode *bEncoded,int Level,DdNode **pCVars)

{
  ulong uVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar5;
  DdNode *bVarNext;
  DdNode *bTemp;
  DdNode *bProd1;
  DdNode *bProd0;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bCof1;
  DdNode *bCof0;
  DdNode *pDStack_58;
  int i;
  DdNode *bCode;
  DdNode *bColumn;
  st__generator *gen;
  st__table *psStack_38;
  int nCols;
  st__table *CutNodes;
  DdNode *bRes;
  DdNode **pCVars_local;
  DdNode *pDStack_18;
  int Level_local;
  DdNode *bEncoded_local;
  DdManager *dd_local;
  
  bRes = (DdNode *)pCVars;
  pCVars_local._4_4_ = Level;
  pDStack_18 = bEncoded;
  bEncoded_local = &dd->sentinel;
  if (Level == s_nVarsBest) {
    psStack_38 = Extra_bddNodePathsUnderCut(dd,bEncoded,s_EncodingVarsLevel);
    gen._4_4_ = 0;
    bColumn = (DdNode *)st__init_gen(psStack_38);
    while (iVar2 = st__gen((st__generator *)bColumn,(char **)&stack0xffffffffffffffa8,
                           (char **)&bCode), iVar2 != 0) {
      uVar1._0_4_ = bEncoded_local[1].index;
      uVar1._4_4_ = bEncoded_local[1].ref;
      if (pDStack_58 == (DdNode *)(uVar1 ^ 1)) {
        Cudd_RecursiveDeref((DdManager *)bEncoded_local,bCode);
        Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDStack_58);
      }
      else {
        s_pbTemp[gen._4_4_] = bCode;
        Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDStack_58);
        gen._4_4_ = gen._4_4_ + 1;
      }
    }
    st__free_gen((st__generator *)bColumn);
    st__free_table(psStack_38);
    if (s_MultiStart == pCVars_local._4_4_) {
      if (gen._4_4_ != 1) {
        __assert_fail("nCols == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                      ,0x296,"DdNode *CreateTheCodes_rec(DdManager *, DdNode *, int, DdNode **)");
      }
      CutNodes = (st__table *)*s_pbTemp;
      Cudd_Ref((DdNode *)CutNodes);
    }
    else {
      CutNodes = (st__table *)
                 Extra_bddEncodingBinary
                           ((DdManager *)bEncoded_local,s_pbTemp,gen._4_4_,
                            (DdNode **)(&bRes->index + (long)pCVars_local._4_4_ * 2),
                            s_MultiStart - pCVars_local._4_4_);
      Cudd_Ref((DdNode *)CutNodes);
    }
    for (bCof0._4_4_ = 0; bCof0._4_4_ < gen._4_4_; bCof0._4_4_ = bCof0._4_4_ + 1) {
      Cudd_RecursiveDeref((DdManager *)bEncoded_local,s_pbTemp[bCof0._4_4_]);
    }
  }
  else {
    pDVar5 = dd->vars[s_VarOrderBest[Level]];
    pDVar3 = Cudd_Cofactor(dd,bEncoded,(DdNode *)((ulong)pDVar5 ^ 1));
    Cudd_Ref(pDVar3);
    pDVar4 = Cudd_Cofactor((DdManager *)bEncoded_local,pDStack_18,pDVar5);
    Cudd_Ref(pDVar4);
    n = CreateTheCodes_rec((DdManager *)bEncoded_local,pDVar3,pCVars_local._4_4_ + 1,(DdNode **)bRes
                          );
    Cudd_Ref(n);
    n_00 = CreateTheCodes_rec((DdManager *)bEncoded_local,pDVar4,pCVars_local._4_4_ + 1,
                              (DdNode **)bRes);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDVar3);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDVar4);
    pDVar3 = Cudd_bddAnd((DdManager *)bEncoded_local,(DdNode *)((ulong)pDVar5 ^ 1),
                         (DdNode *)(*(ulong *)(&bRes->index + (long)pCVars_local._4_4_ * 2) ^ 1));
    Cudd_Ref(pDVar3);
    pDVar5 = Cudd_bddAnd((DdManager *)bEncoded_local,pDVar5,
                         *(DdNode **)(&bRes->index + (long)pCVars_local._4_4_ * 2));
    Cudd_Ref(pDVar5);
    pDVar4 = Cudd_bddAnd((DdManager *)bEncoded_local,pDVar3,n);
    Cudd_Ref(pDVar4);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDVar3);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,n);
    pDVar3 = Cudd_bddAnd((DdManager *)bEncoded_local,pDVar5,n_00);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDVar5);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,n_00);
    CutNodes = (st__table *)Cudd_bddOr((DdManager *)bEncoded_local,pDVar4,pDVar3);
    Cudd_Ref((DdNode *)CutNodes);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDVar4);
    Cudd_RecursiveDeref((DdManager *)bEncoded_local,pDVar3);
  }
  Cudd_Deref((DdNode *)CutNodes);
  return (DdNode *)CutNodes;
}

Assistant:

DdNode * CreateTheCodes_rec( DdManager * dd, DdNode * bEncoded, int Level, DdNode ** pCVars )
// bEncoded is the preliminarily encoded set of columns
// Level is the current level in the recursion
// pCVars are the variables to be used for encoding
{
    DdNode * bRes;
    if ( Level == s_nVarsBest )
    { // the terminal case, when we need to remap the encoded function 
        // from the preliminary encoded variables to the new ones
        st__table * CutNodes;
        int nCols;
//      double nMints;
/*
#ifdef _DEBUG

        {
        DdNode * bTemp;
        // make sure that the given number of variables is enough
        bTemp  = Cudd_bddExistAbstract( dd, bEncoded, s_VarAll );           Cudd_Ref( bTemp );
//      nMints = Cudd_CountMinterm( dd, bTemp, s_MultiStart );
        nMints = Extra_CountMintermsSimple( bTemp, (1<<s_MultiStart) );
        if ( nMints > Extra_Power2( s_MultiStart-Level ) ) 
        {  // the number of minterms is too large to encode the columns 
           // using the given minimum number of encoding variables
            assert( 0 );
        }
        Cudd_RecursiveDeref( dd, bTemp );
        }
#endif
*/
        // get the columns to be re-encoded
        CutNodes = Extra_bddNodePathsUnderCut( dd, bEncoded, s_EncodingVarsLevel );
        // LUT size is the cut level because because the temporary encoding variables 
        // are above the functional variables - this is not true!!!
        // the temporary variables are below!

        // put the entries from the table into the temporary array
        { 
            st__generator * gen;
            DdNode * bColumn, * bCode;
            nCols = 0;
            st__foreach_item( CutNodes, gen, (const char**)&bCode, (char**)&bColumn )
            {
                if ( bCode == b0 )
                { // the unused part of the columns
                    Cudd_RecursiveDeref( dd, bColumn );
                    Cudd_RecursiveDeref( dd, bCode );
                    continue;
                }
                else
                {
                    s_pbTemp[ nCols ] = bColumn; // takes ref
                    Cudd_RecursiveDeref( dd, bCode );
                    nCols++;
                }
            }
            st__free_table( CutNodes );
//          assert( nCols == (int)nMints );
        }

        // encode the columns
        if ( s_MultiStart-Level == 0 ) // we reached the bottom level of recursion
        {
            assert( nCols       == 1 );
//          assert( (int)nMints == 1 );
            bRes = s_pbTemp[0];     Cudd_Ref( bRes );
        }
        else
        {
            bRes = Extra_bddEncodingBinary( dd, s_pbTemp, nCols, pCVars+Level, s_MultiStart-Level ); Cudd_Ref( bRes );
        }

        // deref the columns
        {
            int i;
            for ( i = 0; i < nCols; i++ )
                Cudd_RecursiveDeref( dd, s_pbTemp[i] );
        }
    }
    else
    {
        // cofactor the problem as specified in the best solution
        DdNode * bCof0,  * bCof1;
        DdNode * bRes0,  * bRes1;
        DdNode * bProd0, * bProd1;
        DdNode * bTemp;
        DdNode * bVarNext = dd->vars[ s_VarOrderBest[Level] ];

        bCof0  = Cudd_Cofactor( dd, bEncoded,  Cudd_Not( bVarNext ) );   Cudd_Ref( bCof0 );
        bCof1  = Cudd_Cofactor( dd, bEncoded,            bVarNext   );   Cudd_Ref( bCof1 );

        // call recursively
        bRes0 = CreateTheCodes_rec( dd, bCof0, Level+1, pCVars );  Cudd_Ref( bRes0 );
        bRes1 = CreateTheCodes_rec( dd, bCof1, Level+1, pCVars );  Cudd_Ref( bRes1 );

        Cudd_RecursiveDeref( dd, bCof0 );
        Cudd_RecursiveDeref( dd, bCof1 );

        // compose the result using the identity (bVarNext <=> pCVars[Level])  - this is wrong!
        // compose the result as follows: x'y'F0 + xyF1
        bProd0 = Cudd_bddAnd( dd, Cudd_Not(bVarNext), Cudd_Not(pCVars[Level]) );   Cudd_Ref( bProd0 );
        bProd1 = Cudd_bddAnd( dd,          bVarNext ,          pCVars[Level]  );   Cudd_Ref( bProd1 );

        bProd0 = Cudd_bddAnd( dd, bTemp = bProd0, bRes0 );   Cudd_Ref( bProd0 );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bRes0 );

        bProd1 = Cudd_bddAnd( dd, bTemp = bProd1, bRes1 );   Cudd_Ref( bProd1 );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bRes1 );

        bRes = Cudd_bddOr( dd, bProd0, bProd1 );             Cudd_Ref( bRes );

        Cudd_RecursiveDeref( dd, bProd0 );
        Cudd_RecursiveDeref( dd, bProd1 );
    }
    Cudd_Deref( bRes );
    return bRes;
}